

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchmittTrigger.cpp
# Opt level: O0

void __thiscall
iDynTree::SchmittTrigger::updateDevice(SchmittTrigger *this,double currentTime,double rawValue)

{
  ostream *poVar1;
  byte *in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  if (*(double *)(in_RDI + 8) <= 0.0 && *(double *)(in_RDI + 8) != 0.0) {
    if (in_XMM0_Qa <= 0.0) {
      *(double *)(in_RDI + 8) = in_XMM0_Qa;
    }
    else {
      in_RDI[8] = 0;
      in_RDI[9] = 0;
      in_RDI[10] = 0;
      in_RDI[0xb] = 0;
      in_RDI[0xc] = 0;
      in_RDI[0xd] = 0;
      in_RDI[0xe] = 0;
      in_RDI[0xf] = 0;
    }
  }
  if (*(int *)(in_RDI + 0x40) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Time:: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Qa);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  *(undefined8 *)(in_RDI + 0x38) = in_XMM1_Qa;
  if (*(int *)(in_RDI + 0x40) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Value:: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x38));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (*(int *)(in_RDI + 0x40) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Timer:: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x10));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((*in_RDI & 1) == 0) {
    if (*(double *)(in_RDI + 0x38) < *(double *)(in_RDI + 0x28)) {
      in_RDI[0x10] = 0;
      in_RDI[0x11] = 0;
      in_RDI[0x12] = 0;
      in_RDI[0x13] = 0;
      in_RDI[0x14] = 0;
      in_RDI[0x15] = 0;
      in_RDI[0x16] = 0;
      in_RDI[0x17] = 0;
      if (*(int *)(in_RDI + 0x40) != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Stable low ");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
    }
    else if (*(double *)(in_RDI + 0x10) < *(double *)(in_RDI + 0x20) ||
             *(double *)(in_RDI + 0x10) == *(double *)(in_RDI + 0x20)) {
      *(double *)(in_RDI + 0x10) =
           (in_XMM0_Qa - *(double *)(in_RDI + 8)) + *(double *)(in_RDI + 0x10);
      if (*(int *)(in_RDI + 0x40) != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: I\'m low and waiting ");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      *in_RDI = 1;
      if (*(int *)(in_RDI + 0x40) != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Raising high ");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  else if (*(double *)(in_RDI + 0x30) < *(double *)(in_RDI + 0x38)) {
    in_RDI[0x10] = 0;
    in_RDI[0x11] = 0;
    in_RDI[0x12] = 0;
    in_RDI[0x13] = 0;
    in_RDI[0x14] = 0;
    in_RDI[0x15] = 0;
    in_RDI[0x16] = 0;
    in_RDI[0x17] = 0;
    if (*(int *)(in_RDI + 0x40) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Stable high ");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else if (*(double *)(in_RDI + 0x10) < *(double *)(in_RDI + 0x18) ||
           *(double *)(in_RDI + 0x10) == *(double *)(in_RDI + 0x18)) {
    *(double *)(in_RDI + 0x10) = (in_XMM0_Qa - *(double *)(in_RDI + 8)) + *(double *)(in_RDI + 0x10)
    ;
    if (*(int *)(in_RDI + 0x40) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: I\'m high and waiting ");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    *in_RDI = 0;
    if (*(int *)(in_RDI + 0x40) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"SchmittTrigger: Falling low ");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  *(double *)(in_RDI + 8) = in_XMM0_Qa;
  return;
}

Assistant:

void SchmittTrigger::updateDevice(double currentTime, double rawValue)
{
    if (m_previousTime < 0)
    {
        if (currentTime > 0)
        {
            m_previousTime = 0;
        }
        else
        {
            m_previousTime = currentTime;
        }   
    }
    if (m_verbose) std::cout << "SchmittTrigger: Time:: " << currentTime << std::endl;
    m_rawValue = rawValue;
    
    if (m_verbose) std::cout << "SchmittTrigger: Value:: " << m_rawValue << std::endl;
    if (m_verbose) std::cout << "SchmittTrigger: Timer:: " << m_timer << std::endl;
    
    if (m_currentState == false)
    {   
        // Check for transition - if valid over a timeframe, then switch
        if (m_rawValue >= m_highValueThreshold)
        {               
            if (m_timer > m_stableONTime)
            {
                // rise to high
                m_currentState = true;
                if (m_verbose) std::cout << "SchmittTrigger: Raising high "  << std::endl;
            }
            else
            {
                // wait for timer
                m_timer += (currentTime - m_previousTime);
                if (m_verbose) std::cout << "SchmittTrigger: I'm low and waiting "  << std::endl;
            }            
        }
        else
        {
            // stable low - reset timer
            m_timer = 0;
            if (m_verbose) std::cout << "SchmittTrigger: Stable low "  << std::endl;
        }
    }
    else
    {
        // check for transition - if valid over a timeframe, then switch
        if (m_rawValue <= m_lowValueThreshold)
        {
            if (m_timer > m_stableOFFTime)
            {
                // fall to low
                m_currentState = false;
                if (m_verbose) std::cout << "SchmittTrigger: Falling low "  << std::endl;
            }
            else
            {
                // wait for timer
                m_timer += (currentTime - m_previousTime);
                if (m_verbose) std::cout << "SchmittTrigger: I'm high and waiting "  << std::endl;
            }
        }
        else
        {
            // stable high - reset timer
            m_timer = 0;
            if (m_verbose) std::cout << "SchmittTrigger: Stable high "  << std::endl;
        }
    }
    m_previousTime = currentTime;
}